

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

int __thiscall
jaegertracing::net::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  undefined4 in_register_00000034;
  socklen_t addrLen;
  sockaddr_storage addrStorage;
  socklen_t local_9c;
  sockaddr local_98 [8];
  
  local_9c = 0x80;
  iVar1 = ::accept(*(int *)(CONCAT44(in_register_00000034,__fd) + 4),local_98,&local_9c);
  if (-1 < iVar1) {
    jaegertracing::net::Socket::OSResource::OSResource(&this->_osResource);
    this->_handle = -1;
    this->_family = -1;
    this->_type = -1;
    this->_handle = iVar1;
    this->_family = (uint)(local_9c != 0x10) * 8 + 2;
    this->_type = 1;
    return (int)this;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,iVar1,__ecat,"Failed to accept on socket");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

Socket accept()
    {
        ::sockaddr_storage addrStorage;
        ::socklen_t addrLen = sizeof(addrStorage);
        const auto clientHandle = ::accept(
            _handle, reinterpret_cast<::sockaddr*>(&addrStorage), &addrLen);

        if (isHandleInvalid(clientHandle)) {
            throw std::system_error(
                errno, std::system_category(), "Failed to accept on socket");
        }

        Socket clientSocket;
        clientSocket._handle = clientHandle;
        clientSocket._family =
            (addrLen == sizeof(::sockaddr_in)) ? AF_INET : AF_INET6;
        clientSocket._type = SOCK_STREAM;
        return clientSocket;
    }